

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O3

int logmath_free(logmath_t *lmath)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (lmath != (logmath_t *)0x0) {
    iVar1 = lmath->refcount;
    iVar2 = iVar1 + -1;
    lmath->refcount = iVar2;
    if (iVar1 < 2) {
      if (lmath->filemap == (mmio_file_t *)0x0) {
        ckd_free((lmath->t).table);
      }
      else {
        mmio_file_unmap(lmath->filemap);
      }
      ckd_free(lmath);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
logmath_free(logmath_t *lmath)
{
    if (lmath == NULL)
        return 0;
    if (--lmath->refcount > 0)
        return lmath->refcount;
    if (lmath->filemap)
        mmio_file_unmap(lmath->filemap);
    else
        ckd_free(lmath->t.table);
    ckd_free(lmath);
    return 0;
}